

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O0

void __thiscall
pstd::vector<pbrt::DigitPermutation,_pstd::pmr::polymorphic_allocator<pbrt::DigitPermutation>_>::
reserve(vector<pbrt::DigitPermutation,_pstd::pmr::polymorphic_allocator<pbrt::DigitPermutation>_>
        *this,size_t n)

{
  DigitPermutation *pDVar1;
  iterator pDVar2;
  ulong in_RSI;
  vector<pbrt::DigitPermutation,_pstd::pmr::polymorphic_allocator<pbrt::DigitPermutation>_> *in_RDI;
  int i;
  DigitPermutation *ra;
  DigitPermutation *in_stack_ffffffffffffffc8;
  DigitPermutation *in_stack_ffffffffffffffd0;
  int local_1c;
  
  if (in_RDI->nAlloc < in_RSI) {
    pDVar1 = pmr::polymorphic_allocator<pbrt::DigitPermutation>::
             allocate_object<pbrt::DigitPermutation>
                       ((polymorphic_allocator<pbrt::DigitPermutation> *)in_stack_ffffffffffffffd0,
                        (size_t)in_stack_ffffffffffffffc8);
    for (local_1c = 0; (ulong)(long)local_1c < in_RDI->nStored; local_1c = local_1c + 1) {
      in_stack_ffffffffffffffd0 = pDVar1 + local_1c;
      pDVar2 = begin(in_RDI);
      pmr::polymorphic_allocator<pbrt::DigitPermutation>::
      construct<pbrt::DigitPermutation,pbrt::DigitPermutation>
                (&in_RDI->alloc,in_stack_ffffffffffffffd0,pDVar2 + local_1c);
      pDVar2 = begin(in_RDI);
      pmr::polymorphic_allocator<pbrt::DigitPermutation>::destroy<pbrt::DigitPermutation>
                (&in_RDI->alloc,pDVar2 + local_1c);
    }
    pmr::polymorphic_allocator<pbrt::DigitPermutation>::deallocate_object<pbrt::DigitPermutation>
              ((polymorphic_allocator<pbrt::DigitPermutation> *)in_stack_ffffffffffffffd0,
               in_stack_ffffffffffffffc8,0x6fdca4);
    in_RDI->nAlloc = in_RSI;
    in_RDI->ptr = pDVar1;
  }
  return;
}

Assistant:

void reserve(size_t n) {
        if (nAlloc >= n)
            return;

        T *ra = alloc.template allocate_object<T>(n);
        for (int i = 0; i < nStored; ++i) {
            alloc.template construct<T>(ra + i, std::move(begin()[i]));
            alloc.destroy(begin() + i);
        }

        alloc.deallocate_object(ptr, nAlloc);
        nAlloc = n;
        ptr = ra;
    }